

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O3

size_t fibonacci(char *key,int len,uint32_t seed)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *dc;
  long *plVar5;
  ulong uVar6;
  char *pcVar7;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar8 [16];
  
  uVar4 = (ulong)seed;
  uVar6 = (ulong)len;
  plVar5 = (long *)key;
  pcVar7 = key;
  if (0 < (long)(uVar6 & 0xfffffffffffffff8)) {
    do {
      lVar1 = *plVar5;
      plVar5 = plVar5 + 1;
      pcVar7 = pcVar7 + 8;
      uVar4 = uVar4 + lVar1 * -0x61c8864680b583eb;
    } while (plVar5 < key + (uVar6 & 0xfffffffffffffff8));
  }
  if (plVar5 < key + uVar6 && (uVar6 & 7) != 0) {
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar12 = vpbroadcastq_avx512f(ZEXT816(0x9e3779b97f4a7c15));
    auVar16 = ZEXT864(uVar4);
    uVar4 = 0;
    auVar13 = vpbroadcastq_avx512f();
    do {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vmovdqa64_avx512f(auVar16);
      auVar16 = vporq_avx512f(auVar14,auVar11);
      uVar3 = vpcmpuq_avx512f(auVar16,auVar13,2);
      auVar8 = vmovdqu8_avx512vl(*(undefined1 (*) [16])((long)plVar5 + uVar4));
      auVar9[1] = ((byte)(uVar3 >> 1) & 1) * auVar8[1];
      auVar9[0] = ((byte)uVar3 & 1) * auVar8[0];
      auVar9[2] = ((byte)(uVar3 >> 2) & 1) * auVar8[2];
      auVar9[3] = ((byte)(uVar3 >> 3) & 1) * auVar8[3];
      auVar9[4] = ((byte)(uVar3 >> 4) & 1) * auVar8[4];
      auVar9[5] = ((byte)(uVar3 >> 5) & 1) * auVar8[5];
      auVar9[6] = ((byte)(uVar3 >> 6) & 1) * auVar8[6];
      auVar9[7] = (char)(uVar3 >> 7) * auVar8[7];
      auVar9._8_8_ = 0;
      uVar4 = uVar4 + 8;
      auVar16 = vpmovzxbq_avx512f(auVar9);
      auVar16 = vpmullq_avx512dq(auVar16,auVar12);
      auVar16 = vpaddq_avx512f(auVar16,auVar15);
    } while (((long)(key + uVar6) + (7 - (long)pcVar7) & 0xfffffffffffffff8U) != uVar4);
    auVar11 = vmovdqa64_avx512f(auVar16);
    bVar2 = (bool)((byte)uVar3 & 1);
    auVar12._0_8_ = (ulong)bVar2 * auVar11._0_8_ | (ulong)!bVar2 * auVar15._0_8_;
    bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar12._8_8_ = (ulong)bVar2 * auVar11._8_8_ | (ulong)!bVar2 * auVar15._8_8_;
    bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
    auVar12._16_8_ = (ulong)bVar2 * auVar11._16_8_ | (ulong)!bVar2 * auVar15._16_8_;
    bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
    auVar12._24_8_ = (ulong)bVar2 * auVar11._24_8_ | (ulong)!bVar2 * auVar15._24_8_;
    bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
    auVar12._32_8_ = (ulong)bVar2 * auVar11._32_8_ | (ulong)!bVar2 * auVar15._32_8_;
    bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
    auVar12._40_8_ = (ulong)bVar2 * auVar11._40_8_ | (ulong)!bVar2 * auVar15._40_8_;
    bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
    auVar12._48_8_ = (ulong)bVar2 * auVar11._48_8_ | (ulong)!bVar2 * auVar15._48_8_;
    auVar12._56_8_ = (uVar3 >> 7) * auVar11._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar15._56_8_;
    auVar10 = vextracti64x4_avx512f(auVar12,1);
    auVar11 = vpaddq_avx512f(auVar12,ZEXT3264(auVar10));
    auVar8 = vpaddq_avx(auVar11._0_16_,auVar11._16_16_);
    auVar9 = vpshufd_avx(auVar8,0xee);
    auVar8 = vpaddq_avx(auVar8,auVar9);
    uVar4 = auVar8._0_8_;
  }
  return uVar4;
}

Assistant:

size_t
fibonacci(const char *key, int len, uint32_t seed)
{
  size_t h = (size_t)seed;
  size_t *dw = (size_t *)key; //word stepper
  const size_t *const endw = &((const size_t*)key)[len/sizeof(size_t)];
  while (dw < endw) {
    h += *dw++ * UINT64_C(11400714819323198485);
  }
  if (len & (sizeof(size_t)-1)) {
    uint8_t *dc = (uint8_t*)dw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (dc < endc) {
      h += *dc++ * UINT64_C(11400714819323198485);
    }
  }
  return h;
}